

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockpacking.h
# Opt level: O0

uint32_t * __thiscall
FastPForLib::FastBinaryPacking<8U>::decodeArray
          (FastBinaryPacking<8U> *this,uint32_t *in,size_t param_3,uint32_t *out,size_t *nvalue)

{
  ulong in_RCX;
  uint *in_RSI;
  uint32_t *in_R8;
  uint32_t i;
  uint32_t Bs [4];
  uint32_t *initout;
  uint32_t actuallength;
  uint local_4c;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar1;
  ulong local_20;
  uint32_t *local_10;
  
  local_10 = in_RSI + 1;
  uVar1 = *in_RSI;
  for (local_20 = in_RCX; local_20 < in_RCX + (ulong)uVar1 * 4; local_20 = local_20 + 0x80) {
    local_10 = local_10 + 1;
    for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
      local_10 = fastunpack_8(in_R8,(uint32_t *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                              (uint32_t)(in_RCX >> 0x20));
    }
  }
  *(long *)in_R8 = (long)(local_20 - in_RCX) >> 2;
  return local_10;
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t /*length*/,
                              uint32_t *out, size_t &nvalue) override {
    const uint32_t actuallength = *in++;
    const uint32_t *const initout(out);
    uint32_t Bs[HowManyMiniBlocks];
    for (; out < initout + actuallength; out += BlockSize) {
      Bs[0] = static_cast<uint8_t>(in[0] >> 24);
      Bs[1] = static_cast<uint8_t>(in[0] >> 16);
      Bs[2] = static_cast<uint8_t>(in[0] >> 8);
      Bs[3] = static_cast<uint8_t>(in[0]);
      ++in;
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i) {
        if (MiniBlockSize == 8)
          in = fastunpack_8(in, out + i * MiniBlockSize, Bs[i]);
        else if (MiniBlockSize == 16)
          in = fastunpack_16(in, out + i * MiniBlockSize, Bs[i]);
        else if (MiniBlockSize == 24)
          in = fastunpack_24(in, out + i * MiniBlockSize, Bs[i]);
        else if (MiniBlockSize == 32) {
          fastunpack(in, out + i * MiniBlockSize, Bs[i]);
          in += Bs[i];
        } else
          throw std::logic_error("unsupported MiniBlockSize");
      }
    }
    nvalue = out - initout;
    return in;
  }